

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall phosg::Image::save(Image *this,char *filename,Format format)

{
  pointer f_00;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  Format format_local;
  char *filename_local;
  Image *this_local;
  
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl._4_4_ = format;
  if (filename == (char *)0x0) {
    save(this,_stdout,format);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,filename,&local_51);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"wb",&local_89);
    fopen_unique((phosg *)local_30,&local_50,&local_88,(FILE *)0x0);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::allocator<char>::~allocator(&local_89);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::allocator<char>::~allocator(&local_51);
    f_00 = ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                     ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_30);
    save(this,f_00,
         f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
         super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl._4_4_);
    ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr
              ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_30);
  }
  return;
}

Assistant:

void Image::save(const char* filename, Format format) const {
  if (filename) {
    auto f = fopen_unique(filename, "wb");
    this->save(f.get(), format);
  } else {
    this->save(stdout, format);
  }
}